

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cftfsub(size_t n,float *a,float *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  size_t l;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar5 = 2;
  if (8 < n) {
    cft1st(n,a,w);
    uVar5 = 8;
    if (0x20 < n) {
      uVar4 = 0x20;
      l = 8;
      do {
        uVar5 = uVar4;
        cftmdl(n,l,a,w);
        uVar4 = uVar5 * 4;
        l = uVar5;
      } while (uVar5 * 4 < n);
    }
  }
  if (uVar5 * 4 - n == 0) {
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        lVar1 = uVar4 + uVar5;
        lVar2 = lVar1 + uVar5;
        lVar3 = lVar2 + uVar5;
        fVar10 = a[uVar4] + a[lVar1];
        fVar11 = a[uVar4 + 1] + a[lVar1 + 1];
        fVar7 = a[uVar4] - a[lVar1];
        fVar6 = a[uVar4 + 1] - a[lVar1 + 1];
        fVar12 = a[lVar2] + a[lVar3];
        fVar13 = a[lVar2 + 1] + a[lVar3 + 1];
        fVar8 = a[lVar2] - a[lVar3];
        fVar9 = a[lVar2 + 1] - a[lVar3 + 1];
        a[uVar4] = fVar10 + fVar12;
        a[uVar4 + 1] = fVar11 + fVar13;
        a[lVar2] = fVar10 - fVar12;
        a[lVar2 + 1] = fVar11 - fVar13;
        a[lVar1] = fVar7 - fVar9;
        a[lVar1 + 1] = fVar6 + fVar8;
        a[lVar3] = fVar9 + fVar7;
        a[lVar3 + 1] = fVar6 - fVar8;
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar5);
    }
  }
  else if (uVar5 != 0) {
    uVar4 = 0;
    do {
      fVar6 = a[uVar5 + uVar4];
      fVar7 = a[uVar4];
      fVar8 = a[uVar4 + 1];
      fVar9 = a[uVar5 + uVar4 + 1];
      a[uVar4] = fVar7 + fVar6;
      a[uVar4 + 1] = fVar8 + a[uVar5 + uVar4 + 1];
      a[uVar5 + uVar4] = fVar7 - fVar6;
      a[uVar5 + uVar4 + 1] = fVar8 - fVar9;
      uVar4 = uVar4 + 2;
    } while (uVar4 < uVar5);
  }
  return;
}

Assistant:

static void cftfsub(size_t n, float *a, float *w)
{
    size_t j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}